

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int ossl_bio_cf_out_write(BIO *bio,char *buf,int blen)

{
  Curl_easy *local_60;
  CURLcode local_54;
  ulong uStack_50;
  CURLcode result;
  ssize_t nwritten;
  Curl_easy *data;
  ossl_ctx *octx;
  ssl_connect_data *connssl;
  Curl_cfilter *cf;
  char *pcStack_20;
  int blen_local;
  char *buf_local;
  BIO *bio_local;
  
  cf._4_4_ = blen;
  pcStack_20 = buf;
  buf_local = (char *)bio;
  connssl = (ssl_connect_data *)BIO_get_data(bio);
  octx = (ossl_ctx *)(connssl->peer).sni;
  data = (Curl_easy *)octx[1].ssl;
  if (connssl == (ssl_connect_data *)0x0) {
    local_60 = (Curl_easy *)0x0;
  }
  else {
    local_60 = *(Curl_easy **)((connssl->peer).sni + 0x38);
  }
  nwritten = (ssize_t)local_60;
  local_54 = CURLE_SEND_ERROR;
  if ((int)cf._4_4_ < 0) {
    bio_local._4_4_ = 0;
  }
  else {
    uStack_50 = Curl_conn_cf_send((Curl_cfilter *)(connssl->peer).dispname,local_60,pcStack_20,
                                  (long)(int)cf._4_4_,false,&local_54);
    if ((((nwritten != 0) && ((*(ulong *)(nwritten + 0xa9a) >> 0x1c & 1) != 0)) &&
        ((*(long *)(nwritten + 0x1320) == 0 || (0 < *(int *)(*(long *)(nwritten + 0x1320) + 8)))))
       && ((connssl != (ssl_connect_data *)0x0 && (0 < *(int *)((connssl->peer).hostname + 0xc)))))
    {
      Curl_trc_cf_infof((Curl_easy *)nwritten,(Curl_cfilter *)connssl,
                        "ossl_bio_cf_out_write(len=%d) -> %d, err=%d",(ulong)cf._4_4_,
                        uStack_50 & 0xffffffff,(ulong)local_54);
    }
    BIO_clear_flags((BIO *)buf_local,0xf);
    *(CURLcode *)&(data->multi_queue)._list = local_54;
    if (((long)uStack_50 < 0) && (local_54 == CURLE_AGAIN)) {
      BIO_set_flags((BIO *)buf_local,10);
    }
    bio_local._4_4_ = (int)uStack_50;
  }
  return bio_local._4_4_;
}

Assistant:

static int ossl_bio_cf_out_write(BIO *bio, const char *buf, int blen)
{
  struct Curl_cfilter *cf = BIO_get_data(bio);
  struct ssl_connect_data *connssl = cf->ctx;
  struct ossl_ctx *octx = (struct ossl_ctx *)connssl->backend;
  struct Curl_easy *data = CF_DATA_CURRENT(cf);
  ssize_t nwritten;
  CURLcode result = CURLE_SEND_ERROR;

  DEBUGASSERT(data);
  if(blen < 0)
    return 0;

  nwritten = Curl_conn_cf_send(cf->next, data, buf, (size_t)blen, FALSE,
                               &result);
  CURL_TRC_CF(data, cf, "ossl_bio_cf_out_write(len=%d) -> %d, err=%d",
              blen, (int)nwritten, result);
  BIO_clear_retry_flags(bio);
  octx->io_result = result;
  if(nwritten < 0) {
    if(CURLE_AGAIN == result)
      BIO_set_retry_write(bio);
  }
  return (int)nwritten;
}